

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

size_t __thiscall caffe::WindowDataParameter::ByteSizeLong(WindowDataParameter *this)

{
  bool bVar1;
  uint32 uVar2;
  int iVar3;
  UnknownFieldSet *unknown_fields;
  string *psVar4;
  size_t sVar5;
  size_t sStack_48;
  int cached_size;
  size_t total_size;
  WindowDataParameter *this_local;
  
  sStack_48 = 0;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = WindowDataParameter::unknown_fields(this);
    sStack_48 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  if (((this->_has_bits_).has_bits_[0] & 0xff) != 0) {
    bVar1 = has_source(this);
    if (bVar1) {
      psVar4 = source_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_mean_file(this);
    if (bVar1) {
      psVar4 = mean_file_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_crop_mode(this);
    if (bVar1) {
      psVar4 = crop_mode_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_root_folder(this);
    if (bVar1) {
      psVar4 = root_folder_abi_cxx11_(this);
      sVar5 = google::protobuf::internal::WireFormatLite::StringSize(psVar4);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_batch_size(this);
    if (bVar1) {
      uVar2 = batch_size(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_crop_size(this);
    if (bVar1) {
      uVar2 = crop_size(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_mirror(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 2;
    }
    bVar1 = has_cache_images(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 2;
    }
  }
  if (((this->_has_bits_).has_bits_[0] & 0x1f00) != 0) {
    bVar1 = has_context_pad(this);
    if (bVar1) {
      uVar2 = context_pad(this);
      sVar5 = google::protobuf::internal::WireFormatLite::UInt32Size(uVar2);
      sStack_48 = sVar5 + 1 + sStack_48;
    }
    bVar1 = has_scale(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 5;
    }
    bVar1 = has_fg_threshold(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 5;
    }
    bVar1 = has_bg_threshold(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 5;
    }
    bVar1 = has_fg_fraction(this);
    if (bVar1) {
      sStack_48 = sStack_48 + 5;
    }
  }
  iVar3 = google::protobuf::internal::ToCachedSize(sStack_48);
  this->_cached_size_ = iVar3;
  return sStack_48;
}

Assistant:

size_t WindowDataParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.WindowDataParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  if (_has_bits_[0 / 32] & 255u) {
    // optional string source = 1;
    if (has_source()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->source());
    }

    // optional string mean_file = 3;
    if (has_mean_file()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->mean_file());
    }

    // optional string crop_mode = 11 [default = "warp"];
    if (has_crop_mode()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->crop_mode());
    }

    // optional string root_folder = 13 [default = ""];
    if (has_root_folder()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::StringSize(
          this->root_folder());
    }

    // optional uint32 batch_size = 4;
    if (has_batch_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->batch_size());
    }

    // optional uint32 crop_size = 5 [default = 0];
    if (has_crop_size()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->crop_size());
    }

    // optional bool mirror = 6 [default = false];
    if (has_mirror()) {
      total_size += 1 + 1;
    }

    // optional bool cache_images = 12 [default = false];
    if (has_cache_images()) {
      total_size += 1 + 1;
    }

  }
  if (_has_bits_[8 / 32] & 7936u) {
    // optional uint32 context_pad = 10 [default = 0];
    if (has_context_pad()) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::UInt32Size(
          this->context_pad());
    }

    // optional float scale = 2 [default = 1];
    if (has_scale()) {
      total_size += 1 + 4;
    }

    // optional float fg_threshold = 7 [default = 0.5];
    if (has_fg_threshold()) {
      total_size += 1 + 4;
    }

    // optional float bg_threshold = 8 [default = 0.5];
    if (has_bg_threshold()) {
      total_size += 1 + 4;
    }

    // optional float fg_fraction = 9 [default = 0.25];
    if (has_fg_fraction()) {
      total_size += 1 + 4;
    }

  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}